

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

vector<cv::Mat,_std::allocator<cv::Mat>_> * get_test_src(string *where)

{
  char *__name;
  DIR *pDVar1;
  dirent *__x;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  dirent *dptr;
  DIR *dir_ptr;
  vector<cv::Mat,_std::allocator<cv::Mat>_> *ret;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff28;
  string local_b8 [32];
  string local_98 [96];
  dirent *local_38;
  DIR *local_20;
  undefined1 local_11;
  
  local_11 = 0;
  __lhs = in_RDI;
  std::vector<cv::Mat,_std::allocator<cv::Mat>_>::vector
            ((vector<cv::Mat,_std::allocator<cv::Mat>_> *)0x102431);
  __name = (char *)std::__cxx11::string::c_str();
  pDVar1 = opendir(__name);
  local_20 = pDVar1;
  while (__x = readdir(local_20), __x != (dirent *)0x0) {
    local_38 = __x;
    if (__x->d_name[0] != '.') {
      std::operator+(in_stack_ffffffffffffff28,(char)((ulong)pDVar1 >> 0x38));
      std::operator+(__lhs,(char *)in_RDI);
      cv::imread(local_98,(int)local_b8);
      std::vector<cv::Mat,_std::allocator<cv::Mat>_>::push_back
                ((vector<cv::Mat,_std::allocator<cv::Mat>_> *)in_RDI,(value_type *)__x);
      cv::Mat::~Mat((Mat *)local_98);
      std::__cxx11::string::~string(local_b8);
      std::__cxx11::string::~string((string *)&stack0xffffffffffffff28);
    }
  }
  return (vector<cv::Mat,_std::allocator<cv::Mat>_> *)__lhs;
}

Assistant:

std::vector<cv::Mat> get_test_src(const std::string& where)
{
	std::vector<cv::Mat> ret;
	DIR* dir_ptr = opendir(where.c_str());
	dirent* dptr;
	while((dptr = readdir(dir_ptr)) != NULL)
	{
		if(dptr->d_name[0] == '.')
			continue;
		ret.push_back(cv::imread(where+'/'+dptr->d_name, cv::IMREAD_GRAYSCALE));
	}
	return ret;
}